

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.h
# Opt level: O0

TemplateString * __thiscall
ctemplate::TemplateDictionary::Memdup
          (TemplateString *__return_storage_ptr__,TemplateDictionary *this,TemplateString *s)

{
  undefined7 uVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  TemplateString *s_local;
  TemplateDictionary *this_local;
  
  bVar2 = TemplateString::is_immutable(s);
  if (bVar2) {
    pcVar3 = TemplateString::data(s);
    sVar4 = TemplateString::size(s);
    if (pcVar3[sVar4] == '\0') {
      __return_storage_ptr__->ptr_ = s->ptr_;
      __return_storage_ptr__->length_ = s->length_;
      uVar1 = *(undefined7 *)&s->field_0x11;
      __return_storage_ptr__->is_immutable_ = s->is_immutable_;
      *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar1;
      __return_storage_ptr__->id_ = s->id_;
      return __return_storage_ptr__;
    }
  }
  pcVar3 = TemplateString::data(s);
  sVar4 = TemplateString::size(s);
  Memdup(__return_storage_ptr__,this,pcVar3,sVar4);
  return __return_storage_ptr__;
}

Assistant:

TemplateString Memdup(const TemplateString& s) {
    if (s.is_immutable() && s.data()[s.size()] == '\0') {
      return s;
    }
    return Memdup(s.data(), s.size());
  }